

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceMemcpyCase::init
          (ReferenceMemcpyCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->
        super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Testing performance of memcpy().");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  ctx_00 = (EVP_PKEY_CTX *)
           (long)(this->
                 super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 .m_bufferSizeMax;
  local_190._0_8_ = local_190._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_dstBuf,(size_type)ctx_00,local_190);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void ReferenceMemcpyCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of memcpy()." << tcu::TestLog::EndMessage;

	m_dstBuf.resize(m_bufferSizeMax, 0x00);

	BasicUploadCase<SingleOperationDuration>::init();
}